

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  int iVar1;
  string *extraout_RAX;
  string *psVar2;
  void *ptr;
  RepeatedField<long> *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000031;
  LongSooRep *this_01;
  SooRep *this_02;
  Arena *this_03;
  bool bVar7;
  ulong uVar8;
  Arena *pAStack_90;
  long lStack_88;
  SooRep *pSStack_80;
  Arena aAStack_78 [16];
  LongSooRep *pLStack_68;
  ulong uStack_60;
  ulong uStack_58;
  SooRep SStack_48;
  SooRep *pSStack_38;
  code *pcStack_30;
  LongSooRep LStack_28;
  
  this_01 = &LStack_28;
  uVar4 = (ulong)(uint)size;
  uVar8 = CONCAT71(in_register_00000031,is_soo) & 0xffffffff;
  uVar5 = (this->field_0).long_rep.elements_int;
  bVar7 = SUB81(uVar8,0);
  if (((uVar5 & 4) == 0) == bVar7) {
    psVar2 = (string *)0x0;
  }
  else {
    pcStack_30 = (code *)0x1458c5;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,(uVar5 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (psVar2 == (string *)0x0) {
    if (bVar7 == false) {
      (this->field_0).long_rep.size = size;
    }
    else {
      if (size < 4) {
        psVar2 = (string *)0x0;
      }
      else {
        pcStack_30 = (code *)0x1458da;
        psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (uVar4,3,"size <= kSooSizeMask");
      }
      if (psVar2 != (string *)0x0) goto LAB_001458e7;
      (this->field_0).long_rep.elements_int =
           (long)size | (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
    }
    return;
  }
  pcStack_30 = (code *)0x1458e7;
  set_size();
  psVar2 = extraout_RAX;
LAB_001458e7:
  pcStack_30 = RepeatedField<long>::elements;
  set_size();
  uVar5 = (ulong)psVar2 & 0xffffffff;
  iVar6 = 1;
  if ((int)psVar2 == 0) {
    iVar6 = this_01->capacity;
  }
  pSStack_38 = this;
  pcStack_30 = (code *)uVar4;
  if (iVar6 < 1) {
    uStack_58 = 0x145946;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar6,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if ((char)uVar5 != '\0') {
      return;
    }
    LongSooRep::elements(this_01);
    return;
  }
  this_02 = &SStack_48;
  uStack_58 = 0x145955;
  RepeatedField<long>::elements();
  this_03 = aAStack_78;
  iVar6 = (int)psVar2;
  lVar3 = (long)iVar6;
  pLStack_68 = this_01;
  uStack_60 = uVar8;
  uStack_58 = uVar5;
  if (iVar6 < 0) {
    pSStack_80 = (SooRep *)0x1459be;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar3,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    pSStack_80 = (SooRep *)0x145983;
    iVar1 = SooRep::size(this_02,(undefined1  [16])
                                 ((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
    if (iVar6 < iVar1) {
      psVar2 = (string *)0x0;
    }
    else {
      pSStack_80 = (SooRep *)0x1459d2;
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar3,(long)iVar1,"index < size()");
    }
    if (psVar2 == (string *)0x0) {
      pSStack_80 = (SooRep *)0x1459a0;
      RepeatedField<long>::elements
                ((RepeatedField<long> *)this_02,
                 (undefined1  [16])((undefined1  [16])this_02->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  else {
    pSStack_80 = (SooRep *)0x1459df;
    RepeatedField<long>::Mutable();
  }
  pSStack_80 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  RepeatedField<long>::Mutable();
  lStack_88 = lVar3;
  pSStack_80 = this_02;
  if (this_03 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField<long>::RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_03,0x10);
    pAStack_90 = this_03;
    Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
    Construct<google::protobuf::Arena*>(ptr,&pAStack_90);
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }